

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

optional<double> __thiscall slang::strToDouble(slang *this,string_view str,size_t *pos)

{
  long *__nptr;
  int *piVar1;
  undefined8 unaff_RBP;
  ulong uVar2;
  optional<double> oVar3;
  char *end;
  string copy;
  long *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,str._M_len,this + str._M_len);
  __nptr = local_50[0];
  piVar1 = __errno_location();
  *piVar1 = 0;
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload._M_value = strtod((char *)__nptr,(char **)&local_58);
  if ((__nptr == local_58) || (*piVar1 == 0x22)) {
    uVar2 = 0;
  }
  else {
    uVar2 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    if ((long *)str._M_str != (long *)0x0) {
      *(long *)str._M_str = (long)local_58 - (long)__nptr;
    }
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_8_ = uVar2 & 0xffffffff;
  return (optional<double>)
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

std::optional<double> strToDouble(std::string_view str, size_t* pos) {
    std::string copy(str);
    const char* start = copy.c_str();

    char* end;
    errno = 0;
    double val = strtod(start, &end);

    if (start == end || errno == ERANGE)
        return std::nullopt;

    if (pos)
        *pos = size_t(end - start);
    return val;
}